

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O0

void __thiscall btConvexHullInternal::removeEdgePair(btConvexHullInternal *this,Edge *edge)

{
  long *plVar1;
  Edge *pEVar2;
  long *in_RSI;
  Edge *in_RDI;
  Edge *r;
  Edge *n;
  Edge *this_00;
  
  plVar1 = (long *)*in_RSI;
  this_00 = (Edge *)in_RSI[2];
  if (plVar1 == in_RSI) {
    *(undefined8 *)((long)this_00->target + 0x10) = 0;
  }
  else {
    plVar1[1] = in_RSI[1];
    *(long **)in_RSI[1] = plVar1;
    *(long **)((long)this_00->target + 0x10) = plVar1;
  }
  pEVar2 = this_00->next;
  if (pEVar2 == this_00) {
    *(undefined8 *)(in_RSI[3] + 0x10) = 0;
  }
  else {
    pEVar2->prev = this_00->prev;
    ((PoolArray<btConvexHullInternal::Edge> *)this_00->prev)->array = pEVar2;
    *(Edge **)(in_RSI[3] + 0x10) = pEVar2;
  }
  Pool<btConvexHullInternal::Edge>::freeObject((Pool<btConvexHullInternal::Edge> *)this_00,in_RDI);
  Pool<btConvexHullInternal::Edge>::freeObject((Pool<btConvexHullInternal::Edge> *)this_00,in_RDI);
  *(int *)&in_RDI[3].face = *(int *)&in_RDI[3].face + -1;
  return;
}

Assistant:

void removeEdgePair(Edge* edge)
		{
			Edge* n = edge->next;
			Edge* r = edge->reverse;

			btAssert(edge->target && r->target);

			if (n != edge)
			{
				n->prev = edge->prev;
				edge->prev->next = n;
				r->target->edges = n;
			}
			else
			{
				r->target->edges = NULL;
			}
			
			n = r->next;
			
			if (n != r)
			{
				n->prev = r->prev;
				r->prev->next = n;
				edge->target->edges = n;
			}
			else
			{
				edge->target->edges = NULL;
			}

			edgePool.freeObject(edge);
			edgePool.freeObject(r);
			usedEdgePairs--;
		}